

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::compoundStmt(Parser *this)

{
  bool bVar1;
  Token TVar2;
  SourceLocation *pSVar3;
  SymbolTable *this_00;
  FilePos *endPos;
  pointer pCVar4;
  Parser *in_RSI;
  undefined1 local_88 [8];
  unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> s;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> local_78;
  unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> local_70;
  unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_> var;
  unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_> cs;
  undefined1 local_50 [8];
  SourceLocation sloc;
  Parser *this_local;
  
  pSVar3 = location(in_RSI);
  SourceLocation::SourceLocation((SourceLocation *)local_50,pSVar3);
  nextToken(in_RSI);
  std::make_unique<flow::lang::CompoundStmt,flow::SourceLocation&>((SourceLocation *)&var);
  do {
    TVar2 = token(in_RSI);
    if (TVar2 != Var) goto LAB_00153711;
    varDecl((Parser *)&local_70);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_70);
    if (bVar1) {
      this_00 = currentScope(in_RSI);
      std::unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>>::
      unique_ptr<flow::lang::VariableSym,std::default_delete<flow::lang::VariableSym>,void>
                ((unique_ptr<flow::lang::Symbol,std::default_delete<flow::lang::Symbol>> *)&local_78
                 ,&local_70);
      SymbolTable::appendSymbol(this_00,&local_78);
      std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>::~unique_ptr
                (&local_78);
    }
    else {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
    }
    s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
    super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
    super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._5_3_ = 0;
    s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
    super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
    super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._4_1_ = !bVar1;
    std::unique_ptr<flow::lang::VariableSym,_std::default_delete<flow::lang::VariableSym>_>::
    ~unique_ptr(&local_70);
  } while (s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>.
           _M_t.super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._4_4_ == 0);
  goto LAB_00153826;
  while( true ) {
    stmt((Parser *)local_88);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_88);
    if (bVar1) {
      pCVar4 = std::
               unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
               ::operator->((unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
                             *)&var);
      CompoundStmt::push_back
                (pCVar4,(unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)
                        local_88);
    }
    else {
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 (nullptr_t)0x0);
    }
    s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
    super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
    super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._5_3_ = 0;
    s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
    super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
    super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._4_1_ = !bVar1;
    std::unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>::~unique_ptr
              ((unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *)local_88);
    if (s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
        super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
        super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._4_4_ != 0) break;
LAB_00153711:
    bVar1 = consumeIf(in_RSI,End);
    if (bVar1) {
      pCVar4 = std::
               unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
               ::operator->((unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
                             *)&var);
      pSVar3 = ASTNode::location((ASTNode *)pCVar4);
      endPos = end(in_RSI);
      SourceLocation::update(pSVar3,endPos);
      pCVar4 = std::
               unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
               ::release((unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
                          *)&var);
      std::unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>>::
      unique_ptr<std::default_delete<flow::lang::Stmt>,void>
                ((unique_ptr<flow::lang::Stmt,std::default_delete<flow::lang::Stmt>> *)this,
                 &pCVar4->super_Stmt);
      s._M_t.super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
      super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl._4_4_ = 1;
      break;
    }
  }
LAB_00153826:
  std::unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>::
  ~unique_ptr((unique_ptr<flow::lang::CompoundStmt,_std::default_delete<flow::lang::CompoundStmt>_>
               *)&var);
  SourceLocation::~SourceLocation((SourceLocation *)local_50);
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::compoundStmt() {
  SourceLocation sloc(location());
  nextToken();  // '{'

  std::unique_ptr<CompoundStmt> cs = std::make_unique<CompoundStmt>(sloc);

  while (token() == Token::Var) {
    if (std::unique_ptr<VariableSym> var = varDecl())
      currentScope()->appendSymbol(std::move(var));
    else
      return nullptr;
  }

  for (;;) {
    if (consumeIf(Token::End)) {
      cs->location().update(end());
      return std::unique_ptr<Stmt>(cs.release());
    }

    if (std::unique_ptr<Stmt> s = stmt())
      cs->push_back(std::move(s));
    else
      return nullptr;
  }
}